

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Rect __thiscall nite::Rect::operator-(Rect *this,Rect *r)

{
  float fVar1;
  float *in_RDX;
  Rect RVar2;
  Rect *r_local;
  Rect *this_local;
  Rect *R;
  
  Rect(this,r);
  this->x = this->x - *in_RDX;
  this->y = this->y - in_RDX[1];
  this->w = this->w - in_RDX[2];
  fVar1 = in_RDX[3];
  RVar2.x = this->h - fVar1;
  RVar2.y = 0.0;
  this->h = RVar2.x;
  RVar2.w = fVar1;
  RVar2.h = 0.0;
  return RVar2;
}

Assistant:

nite::Rect nite::Rect::operator-(const nite::Rect &r){
	Rect R = *this;
	R.x -= r.x;
	R.y -= r.y;
	R.w -= r.w;
	R.h -= r.h;
	return R;
}